

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O0

void gost_grasshopper_cipher_destroy(gost_grasshopper_cipher_ctx *c)

{
  long in_RDI;
  int i;
  undefined4 local_c;
  
  for (local_c = 0; local_c < 2; local_c = local_c + 1) {
    grasshopper_zero128((grasshopper_w128_t *)(in_RDI + 0x28 + (long)local_c * 0x10));
    grasshopper_zero128((grasshopper_w128_t *)(in_RDI + 8 + (long)local_c * 0x10));
  }
  for (local_c = 0; local_c < 10; local_c = local_c + 1) {
    grasshopper_zero128((grasshopper_w128_t *)(in_RDI + 0x48 + (long)local_c * 0x10));
  }
  for (local_c = 0; local_c < 10; local_c = local_c + 1) {
    grasshopper_zero128((grasshopper_w128_t *)(in_RDI + 0xe8 + (long)local_c * 0x10));
  }
  grasshopper_zero128((grasshopper_w128_t *)(in_RDI + 0x188));
  return;
}

Assistant:

static GRASSHOPPER_INLINE void
gost_grasshopper_cipher_destroy(gost_grasshopper_cipher_ctx * c)
{
    int i;
    for (i = 0; i < 2; i++) {
        grasshopper_zero128(&c->key.k.k[i]);
        grasshopper_zero128(&c->master_key.k.k[i]);
    }
    for (i = 0; i < GRASSHOPPER_ROUND_KEYS_COUNT; i++) {
        grasshopper_zero128(&c->encrypt_round_keys.k[i]);
    }
    for (i = 0; i < GRASSHOPPER_ROUND_KEYS_COUNT; i++) {
        grasshopper_zero128(&c->decrypt_round_keys.k[i]);
    }
    grasshopper_zero128(&c->buffer);
}